

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::strings_internal::BigUnsigned<4>::AddWithCarry(BigUnsigned<4> *this,int index,uint32_t value)

{
  int *piVar1;
  uint in_EDX;
  long lVar2;
  int in_ESI;
  int *in_RDI;
  int local_18 [3];
  int local_c;
  
  local_18[2] = in_EDX;
  local_c = in_ESI;
  if (in_EDX != 0) {
    for (; local_c < 4 && local_18[2] != 0;
        local_18[2] = (int)((uint)in_RDI[lVar2 + 1] < (uint)local_18[2])) {
      in_RDI[(long)local_c + 1] = local_18[2] + in_RDI[(long)local_c + 1];
      lVar2 = (long)local_c;
      if ((uint)in_RDI[lVar2 + 1] < (uint)local_18[2]) {
        local_c = local_c + 1;
      }
    }
    local_18[1] = 4;
    local_18[0] = local_c + 1;
    piVar1 = std::max<int>(local_18,in_RDI);
    piVar1 = std::min<int>(local_18 + 1,piVar1);
    *in_RDI = *piVar1;
  }
  return;
}

Assistant:

void AddWithCarry(int index, uint32_t value) {
    if (value) {
      while (index < max_words && value > 0) {
        words_[index] += value;
        // carry if we overflowed in this word:
        if (value > words_[index]) {
          value = 1;
          ++index;
        } else {
          value = 0;
        }
      }
      size_ = (std::min)(max_words, (std::max)(index + 1, size_));
    }
  }